

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  TokenType TVar1;
  undefined1 local_70 [80];
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume((Token *)local_70,this);
    if (4 < local_70._32_4_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                    ,0x61,"const std::string &wabt::Token::text() const");
    }
    std::__cxx11::string::_M_assign((string *)out_label,(string *)(local_70 + 0x28));
    Token::~Token((Token *)local_70);
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = Consume().text();
  } else {
    out_label->clear();
  }
  return Result::Ok;
}